

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::MergeFromCodedStream(MessageLite *this,CodedInputStream *input)

{
  uint uVar1;
  LogMessage *other;
  MessageLite *message;
  CodedInputStream *input_local;
  MessageLite *this_local;
  string local_78;
  LogMessage local_58;
  MessageLite *local_20;
  CodedInputStream *local_18;
  bool local_9;
  
  local_20 = this;
  local_18 = input;
  uVar1 = (*this->_vptr_MessageLite[0xb])(this,input);
  if ((uVar1 & 1) == 0) {
    local_9 = false;
  }
  else {
    uVar1 = (*local_20->_vptr_MessageLite[8])();
    if ((uVar1 & 1) == 0) {
      message = (MessageLite *)0x79;
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
                 ,0x79);
      (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
                (&local_78,(_anonymous_namespace_ *)"parse",(char *)local_20,message);
      other = internal::LogMessage::operator<<(&local_58,&local_78);
      internal::LogFinisher::operator=((LogFinisher *)((long)&this_local + 3),other);
      std::__cxx11::string::~string((string *)&local_78);
      internal::LogMessage::~LogMessage(&local_58);
      local_9 = false;
    }
    else {
      local_9 = true;
    }
  }
  return local_9;
}

Assistant:

bool MessageLite::MergeFromCodedStream(io::CodedInputStream* input) {
  return InlineMergeFromCodedStream(input, this);
}